

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O0

void __thiscall
nlohmann::detail::
serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::dump_escaped(serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               *this,string_t *s,bool ensure_ascii)

{
  value_type vVar1;
  ulong uVar2;
  uint8_t uVar3;
  _Setfill<char> _Var4;
  _Setw _Var5;
  ulong uVar6;
  byte *pbVar7;
  pointer pvVar8;
  size_type sVar9;
  element_type *peVar10;
  ostream *poVar11;
  undefined8 uVar12;
  void *this_00;
  value_type *pvVar13;
  reference pvVar14;
  char *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  byte in_DL;
  ulong in_RSI;
  string *in_RDI;
  stringstream ss_1;
  stringstream ss;
  uint8_t byte;
  size_t i;
  size_t bytes;
  uint8_t state;
  uint32_t codepoint;
  uint32_t *in_stack_fffffffffffffb08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb40;
  undefined7 in_stack_fffffffffffffb48;
  value_type in_stack_fffffffffffffb4f;
  int in_stack_fffffffffffffbac;
  int id_;
  stringstream local_408 [16];
  ostream local_3f8 [383];
  undefined1 local_279;
  char local_1d5;
  int local_1c4;
  stringstream local_1c0 [16];
  ostream local_1b0 [383];
  byte local_31;
  ulong local_30;
  long local_28;
  char local_19;
  uint local_18;
  byte local_11;
  ulong local_10;
  
  local_11 = in_DL & 1;
  local_19 = '\0';
  local_28 = 0;
  local_30 = 0;
  local_10 = in_RSI;
  do {
    uVar2 = local_30;
    uVar6 = std::__cxx11::string::size();
    if (uVar6 <= uVar2) {
      if (local_19 == '\0') {
        if (local_28 != 0) {
          peVar10 = std::
                    __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x15c067);
          pvVar8 = std::array<char,_512UL>::data((array<char,_512UL> *)0x15c07d);
          (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,pvVar8,local_28);
        }
        return;
      }
      std::__cxx11::stringstream::stringstream(local_408);
      _Var5 = std::setw(2);
      poVar11 = std::operator<<(local_3f8,_Var5);
      uVar12 = std::ostream::operator<<(poVar11,std::uppercase);
      _Var4 = std::setfill<char>('0');
      poVar11 = std::operator<<(uVar12,_Var4._M_c);
      __lhs = (char *)std::ostream::operator<<(poVar11,std::hex);
      pbVar7 = (byte *)std::__cxx11::string::back();
      std::ostream::operator<<(__lhs,(uint)*pbVar7);
      id_ = CONCAT13(1,(int3)in_stack_fffffffffffffbac);
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x20);
      std::__cxx11::stringstream::str();
      std::operator+(__lhs,__rhs);
      type_error::create(id_,in_RDI);
      __cxa_throw(__rhs,&type_error::typeinfo,type_error::~type_error);
    }
    pbVar7 = (byte *)std::__cxx11::string::operator[](local_10);
    local_31 = *pbVar7;
    uVar3 = decode((uint8_t *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,'\0');
    if (uVar3 == '\0') {
      if (local_18 == 8) {
        local_28 = local_28 + 1;
        pvVar14 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffb10,
                             (size_type)in_stack_fffffffffffffb08);
        *pvVar14 = '\\';
        local_28 = local_28 + 1;
        pvVar14 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffb10,
                             (size_type)in_stack_fffffffffffffb08);
        *pvVar14 = 'b';
      }
      else if (local_18 == 9) {
        local_28 = local_28 + 1;
        pvVar14 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffb10,
                             (size_type)in_stack_fffffffffffffb08);
        *pvVar14 = '\\';
        local_28 = local_28 + 1;
        pvVar14 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffb10,
                             (size_type)in_stack_fffffffffffffb08);
        *pvVar14 = 't';
      }
      else if (local_18 == 10) {
        local_28 = local_28 + 1;
        pvVar14 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffb10,
                             (size_type)in_stack_fffffffffffffb08);
        *pvVar14 = '\\';
        local_28 = local_28 + 1;
        pvVar14 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffb10,
                             (size_type)in_stack_fffffffffffffb08);
        *pvVar14 = 'n';
      }
      else if (local_18 == 0xc) {
        local_28 = local_28 + 1;
        pvVar14 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffb10,
                             (size_type)in_stack_fffffffffffffb08);
        *pvVar14 = '\\';
        local_28 = local_28 + 1;
        pvVar14 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffb10,
                             (size_type)in_stack_fffffffffffffb08);
        *pvVar14 = 'f';
      }
      else if (local_18 == 0xd) {
        local_28 = local_28 + 1;
        pvVar14 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffb10,
                             (size_type)in_stack_fffffffffffffb08);
        *pvVar14 = '\\';
        local_28 = local_28 + 1;
        pvVar14 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffb10,
                             (size_type)in_stack_fffffffffffffb08);
        *pvVar14 = 'r';
      }
      else if (local_18 == 0x22) {
        local_28 = local_28 + 1;
        pvVar14 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffb10,
                             (size_type)in_stack_fffffffffffffb08);
        *pvVar14 = '\\';
        local_28 = local_28 + 1;
        pvVar14 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffb10,
                             (size_type)in_stack_fffffffffffffb08);
        *pvVar14 = '\"';
      }
      else if (local_18 == 0x5c) {
        local_28 = local_28 + 1;
        pvVar14 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffb10,
                             (size_type)in_stack_fffffffffffffb08);
        *pvVar14 = '\\';
        local_28 = local_28 + 1;
        pvVar14 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffb10,
                             (size_type)in_stack_fffffffffffffb08);
        *pvVar14 = '\\';
      }
      else if ((local_18 < 0x20) || (((local_11 & 1) != 0 && (0x7e < local_18)))) {
        if (local_18 < 0x10000) {
          pvVar8 = std::array<char,_512UL>::data((array<char,_512UL> *)0x15bbc8);
          snprintf(pvVar8 + local_28,7,"\\u%04x",(ulong)(local_18 & 0xffff));
          local_28 = local_28 + 6;
        }
        else {
          pvVar8 = std::array<char,_512UL>::data((array<char,_512UL> *)0x15bc17);
          snprintf(pvVar8 + local_28,0xd,"\\u%04x\\u%04x",
                   (ulong)((local_18 >> 10) + 0xd7c0 & 0xffff),
                   (ulong)((local_18 & 0x3ff) + 0xdc00 & 0xffff));
          local_28 = local_28 + 0xc;
        }
      }
      else {
        pvVar13 = (value_type *)std::__cxx11::string::operator[](local_10);
        vVar1 = *pvVar13;
        local_28 = local_28 + 1;
        pvVar14 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffb10,
                             (size_type)in_stack_fffffffffffffb08);
        *pvVar14 = vVar1;
      }
      sVar9 = std::array<char,_512UL>::size((array<char,_512UL> *)((long)&in_RDI[2].field_2 + 10));
      if (sVar9 - local_28 < 0xd) {
        peVar10 = std::
                  __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x15bcef);
        pvVar8 = std::array<char,_512UL>::data((array<char,_512UL> *)0x15bd05);
        (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,pvVar8,local_28);
        local_28 = 0;
      }
    }
    else {
      if (uVar3 == '\x01') {
        std::__cxx11::stringstream::stringstream(local_1c0);
        local_1c4 = (int)std::setw(2);
        poVar11 = std::operator<<(local_1b0,(_Setw)local_1c4);
        uVar12 = std::ostream::operator<<(poVar11,std::uppercase);
        local_1d5 = (char)std::setfill<char>('0');
        poVar11 = std::operator<<(uVar12,local_1d5);
        this_00 = (void *)std::ostream::operator<<(poVar11,std::hex);
        std::ostream::operator<<(this_00,(uint)local_31);
        local_279 = 1;
        uVar12 = __cxa_allocate_exception(0x20);
        std::__cxx11::to_string(CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
        std::operator+((char *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
        std::operator+(in_stack_fffffffffffffb18,(char *)in_stack_fffffffffffffb10);
        std::__cxx11::stringstream::str();
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48),
                       in_stack_fffffffffffffb40);
        type_error::create(in_stack_fffffffffffffbac,in_RDI);
        local_279 = 0;
        __cxa_throw(uVar12,&type_error::typeinfo,type_error::~type_error);
      }
      if ((local_11 & 1) == 0) {
        pvVar13 = (value_type *)std::__cxx11::string::operator[](local_10);
        in_stack_fffffffffffffb4f = *pvVar13;
        local_28 = local_28 + 1;
        pvVar14 = std::array<char,_512UL>::operator[]
                            ((array<char,_512UL> *)in_stack_fffffffffffffb10,
                             (size_type)in_stack_fffffffffffffb08);
        *pvVar14 = in_stack_fffffffffffffb4f;
      }
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

void dump_escaped(const string_t& s, const bool ensure_ascii)
{
uint32_t codepoint;
uint8_t state = UTF8_ACCEPT;
std::size_t bytes = 0;  // number of bytes written to string_buffer

for (std::size_t i = 0; i < s.size(); ++i)
{
const auto byte = static_cast<uint8_t>(s[i]);

switch (decode(state, codepoint, byte))
{
case UTF8_ACCEPT:  // decode found a new code point
{
switch (codepoint)
{
case 0x08: // backspace
{
string_buffer[bytes++] = '\\';
string_buffer[bytes++] = 'b';
break;
}

case 0x09: // horizontal tab
{
string_buffer[bytes++] = '\\';
string_buffer[bytes++] = 't';
break;
}

case 0x0A: // newline
{
string_buffer[bytes++] = '\\';
string_buffer[bytes++] = 'n';
break;
}

case 0x0C: // formfeed
{
string_buffer[bytes++] = '\\';
string_buffer[bytes++] = 'f';
break;
}

case 0x0D: // carriage return
{
string_buffer[bytes++] = '\\';
string_buffer[bytes++] = 'r';
break;
}

case 0x22: // quotation mark
{
string_buffer[bytes++] = '\\';
string_buffer[bytes++] = '\"';
break;
}

case 0x5C: // reverse solidus
{
string_buffer[bytes++] = '\\';
string_buffer[bytes++] = '\\';
break;
}

default:
{
// escape control characters (0x00..0x1F) or, if
// ensure_ascii parameter is used, non-ASCII characters
if ((codepoint <= 0x1F) or (ensure_ascii and (codepoint >= 0x7F)))
{
if (codepoint <= 0xFFFF)
{
std::snprintf(string_buffer.data() + bytes, 7, "\\u%04x",
static_cast<uint16_t>(codepoint));
bytes += 6;
}
else
{
std::snprintf(string_buffer.data() + bytes, 13, "\\u%04x\\u%04x",
static_cast<uint16_t>(0xD7C0 + (codepoint >> 10)),
static_cast<uint16_t>(0xDC00 + (codepoint & 0x3FF)));
bytes += 12;
}
}
else
{
// copy byte to buffer (all previous bytes
// been copied have in default case above)
string_buffer[bytes++] = s[i];
}
break;
}
}

// write buffer and reset index; there must be 13 bytes
// left, as this is the maximal number of bytes to be
// written ("\uxxxx\uxxxx\0") for one code point
if (string_buffer.size() - bytes < 13)
{
o->write_characters(string_buffer.data(), bytes);
bytes = 0;
}
break;
}

case UTF8_REJECT:  // decode found invalid UTF-8 byte
{
std::stringstream ss;
ss << std::setw(2) << std::uppercase << std::setfill('0') << std::hex << static_cast<int>(byte);
JSON_THROW(type_error::create(316, "invalid UTF-8 byte at index " + std::to_string(i) + ": 0x" + ss.str()));
}

default:  // decode found yet incomplete multi-byte code point
{
if (not ensure_ascii)
{
// code point will not be escaped - copy byte to buffer
string_buffer[bytes++] = s[i];
}
break;
}
}
}

if (JSON_LIKELY(state == UTF8_ACCEPT))
{
// write buffer
if (bytes > 0)
{
o->write_characters(string_buffer.data(), bytes);
}
}
else
{
// we finish reading, but do not accept: string was incomplete
std::stringstream ss;
ss << std::setw(2) << std::uppercase << std::setfill('0') << std::hex << static_cast<int>(static_cast<uint8_t>(s.back()));
JSON_THROW(type_error::create(316, "incomplete UTF-8 string; last byte: 0x" + ss.str()));
}
}